

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseConstList(WastParser *this,ConstVector *consts,ConstType type)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  bool local_189;
  Location local_178;
  undefined1 local_158 [8];
  Token token_1;
  char *local_110;
  size_type local_108;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_100;
  undefined1 local_f8 [8];
  Token token;
  undefined1 local_b0 [8];
  Const const_;
  ConstType type_local;
  ConstVector *consts_local;
  WastParser *this_local;
  
  while( true ) {
    bVar1 = PeekMatchLpar(this,Const);
    local_189 = true;
    if (!bVar1) {
      bVar1 = PeekMatchLpar(this,RefNull);
      local_189 = true;
      if (!bVar1) {
        bVar1 = PeekMatchLpar(this,RefHost);
        local_189 = true;
        if (!bVar1) {
          local_189 = PeekMatchLpar(this,RefFunc);
        }
      }
    }
    if (local_189 == false) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    Consume((Token *)(const_.nan_ + 2),this);
    Const::Const((Const *)local_b0);
    TVar2 = Peek(this,0);
    switch(TVar2) {
    case Const:
      token.field_2.literal_.text.size_._4_4_ = ParseConst(this,(Const *)local_b0,type);
      bVar1 = Failed((Result)token.field_2.literal_.text.size_._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      break;
    default:
      __assert_fail("!\"unreachable\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                    ,0x977,"Result wabt::WastParser::ParseConstList(ConstVector *, ConstType)");
    case RefFunc:
      Consume((Token *)local_158,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)local_158);
      GetLocation(&local_178,this);
      local_b0 = (undefined1  [8])local_178.filename.data_;
      const_.loc.filename.data_ = (char *)local_178.filename.size_;
      const_.loc.filename.size_ = (size_type)local_178.field_1.field_1.offset;
      const_.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           local_178.field_1._8_8_;
      Const::set_funcref((Const *)local_b0);
      break;
    case RefNull:
      Consume((Token *)local_f8,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)local_f8);
      GetLocation((Location *)&token_1.field_2.literal_.text.size_,this);
      local_b0 = (undefined1  [8])token_1.field_2.literal_.text.size_;
      const_.loc.filename.data_ = local_110;
      const_.loc.filename.size_ = local_108;
      const_.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_100.offset;
      Const::set_nullref((Const *)local_b0);
      break;
    case RefHost:
      RVar3 = ParseHostRef(this,(Const *)local_b0);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    RVar3 = Expect(this,Rpar);
    bVar1 = Failed(RVar3);
    if (bVar1) break;
    std::vector<wabt::Const,_std::allocator<wabt::Const>_>::push_back(consts,(value_type *)local_b0)
    ;
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseConstList(ConstVector* consts, ConstType type) {
  WABT_TRACE(ParseConstList);
  while (PeekMatchLpar(TokenType::Const) || PeekMatchLpar(TokenType::RefNull) ||
         PeekMatchLpar(TokenType::RefHost) ||
         PeekMatchLpar(TokenType::RefFunc)) {
    Consume();
    Const const_;
    switch (Peek()) {
      case TokenType::Const:
        CHECK_RESULT(ParseConst(&const_, type));
        break;
      case TokenType::RefNull: {
        auto token = Consume();
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_nullref();
        break;
      }
      case TokenType::RefFunc: {
        auto token = Consume();
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_funcref();
        break;
      }
      case TokenType::RefHost:
        CHECK_RESULT(ParseHostRef(&const_));
        break;
      default:
        assert(!"unreachable");
        return Result::Error;
    }
    EXPECT(Rpar);
    consts->push_back(const_);
  }

  return Result::Ok;
}